

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::BufferID>::emplaceRealloc<slang::BufferID>
          (SmallVectorBase<slang::BufferID> *this,pointer pos,BufferID *args)

{
  pointer pBVar1;
  ulong uVar2;
  BufferID *__cur_1;
  pointer pBVar3;
  pointer pBVar4;
  uint32_t *puVar5;
  pointer pBVar6;
  EVP_PKEY_CTX *pEVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  
  if (this->len == 0x1fffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar7 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar7 < ctx) {
    pEVar7 = ctx;
  }
  if (0x1fffffffffffffff - uVar2 < uVar2) {
    pEVar7 = (EVP_PKEY_CTX *)0x1fffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pBVar3 = (pointer)operator_new((long)pEVar7 * 4);
  *(uint32_t *)((long)pBVar3 + lVar8) = args->id;
  pBVar6 = this->data_;
  pBVar1 = pBVar6 + this->len;
  pBVar4 = pBVar3;
  if (pBVar1 == pos) {
    for (; pBVar6 != pos; pBVar6 = pBVar6 + 1) {
      pBVar4->id = pBVar6->id;
      pBVar4 = pBVar4 + 1;
    }
  }
  else {
    for (; pBVar6 != pos; pBVar6 = pBVar6 + 1) {
      ctx = (EVP_PKEY_CTX *)(ulong)pBVar6->id;
      pBVar4->id = pBVar6->id;
      pBVar4 = pBVar4 + 1;
    }
    puVar5 = (uint32_t *)(lVar8 + (long)pBVar3);
    for (; puVar5 = puVar5 + 1, pos != pBVar1; pos = pos + 1) {
      *puVar5 = pos->id;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar7;
  this->data_ = pBVar3;
  return (pointer)((long)pBVar3 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}